

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O0

void sptk::world::inv(double **r,int n,double **invr)

{
  double dVar1;
  int k_2;
  int j_4;
  int i_3;
  int k_1;
  int k;
  int j_3;
  int j_2;
  int j_1;
  int i_2;
  double tmp;
  int i_1;
  int j;
  int i;
  double **invr_local;
  int n_local;
  double **r_local;
  
  for (i = 0; i < n; i = i + 1) {
    for (j = 0; j < n; j = j + 1) {
      invr[i][j] = 0.0;
    }
  }
  for (i_1 = 0; i_1 < n; i_1 = i_1 + 1) {
    invr[i_1][i_1] = 1.0;
  }
  for (i_2 = 0; i_2 < n; i_2 = i_2 + 1) {
    dVar1 = r[i_2][i_2];
    r[i_2][i_2] = 1.0;
    for (j_1 = 0; j_2 = i_2, j_1 <= i_2; j_1 = j_1 + 1) {
      invr[i_2][j_1] = invr[i_2][j_1] / dVar1;
    }
    while (j_2 = j_2 + 1, j_3 = i_2, j_2 < n) {
      r[i_2][j_2] = r[i_2][j_2] / dVar1;
    }
    while (j_3 = j_3 + 1, j_3 < n) {
      dVar1 = r[j_3][i_2];
      for (k = 0; k <= i_2; k = k + 1) {
        invr[j_3][k] = -invr[i_2][k] * dVar1 + invr[j_3][k];
      }
      for (k_1 = i_2; k_1 < n; k_1 = k_1 + 1) {
        r[j_3][k_1] = -r[i_2][k_1] * dVar1 + r[j_3][k_1];
      }
    }
  }
  for (i_3 = n + -1; -1 < i_3; i_3 = i_3 + -1) {
    for (j_4 = 0; j_4 < i_3; j_4 = j_4 + 1) {
      dVar1 = r[j_4][i_3];
      for (k_2 = 0; k_2 < n; k_2 = k_2 + 1) {
        invr[j_4][k_2] = -invr[i_3][k_2] * dVar1 + invr[j_4][k_2];
      }
    }
  }
  return;
}

Assistant:

void inv(double **r, int n, double **invr) {
  for (int i = 0; i < n; ++i)
    for (int j = 0; j < n; ++j) invr[i][j] = 0.0;
  for (int i = 0; i < n; ++i) invr[i][i] = 1.0;

  double tmp;
  for (int i = 0; i < n; ++i) {
    tmp = r[i][i];
    r[i][i] = 1.0;
    for (int j = 0; j <= i; ++j) invr[i][j] /= tmp;
    for (int j = i + 1; j < n; ++j) r[i][j] /= tmp;
    for (int j = i + 1; j < n; ++j) {
      tmp = r[j][i];
      for (int k = 0; k <= i; ++k) invr[j][k] -= invr[i][k] * tmp;
      for (int k = i; k < n; ++k) r[j][k] -= r[i][k] * tmp;
    }
  }

  for (int i = n - 1; i >= 0; --i) {
    for (int j = 0; j < i; ++j) {
      tmp = r[j][i];
      for (int k = 0; k < n; ++k) invr[j][k] -= invr[i][k] * tmp;
    }
  }
}